

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

void __thiscall cmake::SetDirectoriesFromFile(cmake *this,string *arg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmState *this_00;
  bool bVar2;
  bool bVar3;
  int iVar4;
  char *__s;
  size_t sVar5;
  string *psVar6;
  bool collapse;
  bool collapse_00;
  string path;
  string cacheFile;
  string listFile;
  string listPath;
  string cachePath;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  bVar2 = cmsys::SystemTools::FileIsDirectory(arg);
  if (bVar2) {
    cmsys::SystemTools::CollapseFullPath(&local_d0,arg);
    cmsys::SystemTools::ConvertToUnixSlashes(&local_d0);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,local_d0._M_dataplus._M_p,
               local_d0._M_dataplus._M_p + local_d0._M_string_length);
    std::__cxx11::string::append((char *)&local_b0);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,local_d0._M_dataplus._M_p,
               local_d0._M_dataplus._M_p + local_d0._M_string_length);
    std::__cxx11::string::append((char *)&local_90);
    bVar2 = cmsys::SystemTools::FileExists(&local_b0);
    if (bVar2) {
      std::__cxx11::string::_M_assign((string *)&local_50);
    }
    bVar2 = cmsys::SystemTools::FileExists(&local_90);
    if (bVar2) {
      std::__cxx11::string::_M_assign((string *)&local_70);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    bVar2 = false;
  }
  else {
    bVar2 = cmsys::SystemTools::FileExists(arg);
    if (bVar2) {
      cmsys::SystemTools::CollapseFullPath(&local_d0,arg);
      cmsys::SystemTools::GetFilenameName(&local_b0,&local_d0);
      cmsys::SystemTools::LowerCase(&local_90,&local_b0);
      std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      iVar4 = std::__cxx11::string::compare((char *)&local_b0);
      if (iVar4 == 0) {
        cmsys::SystemTools::GetFilenamePath(&local_90,&local_d0);
        psVar6 = &local_50;
LAB_0022093b:
        std::__cxx11::string::operator=((string *)psVar6,(string *)&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)&local_b0);
        if (iVar4 == 0) {
          cmsys::SystemTools::GetFilenamePath(&local_90,&local_d0);
          psVar6 = &local_70;
          goto LAB_0022093b;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      bVar2 = true;
    }
    else {
      cmsys::SystemTools::CollapseFullPath(&local_d0,arg);
      cmsys::SystemTools::GetFilenameName(&local_b0,&local_d0);
      cmsys::SystemTools::LowerCase(&local_90,&local_b0);
      std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      iVar4 = std::__cxx11::string::compare((char *)&local_b0);
      if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)&local_b0), iVar4 == 0)) {
        cmsys::SystemTools::GetFilenamePath(&local_90,&local_d0);
        std::__cxx11::string::operator=((string *)&local_70,(string *)&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        bVar2 = true;
      }
      else {
        std::__cxx11::string::_M_assign((string *)&local_70);
        bVar2 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if ((local_50._M_string_length == 0) || (bVar3 = LoadCache(this,&local_50), !bVar3)) {
LAB_00220a63:
    if (local_70._M_string_length == 0) {
      psVar6 = cmState::GetSourceDirectory_abi_cxx11_
                         ((this->State)._M_t.
                          super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                          super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                          super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
      if (psVar6->_M_string_length == 0) {
        cmsys::SystemTools::CollapseFullPath(&local_d0,arg);
        SetHomeDirectory(this,&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
      }
      psVar6 = cmState::GetBinaryDirectory_abi_cxx11_
                         ((this->State)._M_t.
                          super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                          super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                          super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
      if (psVar6->_M_string_length != 0) goto LAB_00220b56;
      cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
                (&local_d0,(SystemTools *)0x1,collapse);
      SetHomeOutputDirectory(this,&local_d0);
    }
    else {
      SetHomeDirectory(this,&local_70);
      if (bVar2) {
        SetHomeOutputDirectory(this,&local_70);
        goto LAB_00220b56;
      }
      psVar6 = cmState::GetBinaryDirectory_abi_cxx11_
                         ((this->State)._M_t.
                          super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                          super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                          super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
      if (psVar6->_M_string_length != 0) goto LAB_00220b56;
      cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
                (&local_d0,(SystemTools *)0x1,collapse_00);
      SetHomeOutputDirectory(this,&local_d0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p == &local_d0.field_2) goto LAB_00220b56;
  }
  else {
    this_00 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
              super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
              super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
    paVar1 = &local_d0.field_2;
    local_d0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"CMAKE_HOME_DIRECTORY","");
    __s = cmState::GetCacheEntryValue(this_00,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if (__s == (char *)0x0) goto LAB_00220a63;
    SetHomeOutputDirectory(this,&local_50);
    local_d0._M_dataplus._M_p = (pointer)paVar1;
    sVar5 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,__s,__s + sVar5);
    SetHomeDirectory(this,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p == paVar1) goto LAB_00220b56;
  }
  operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
LAB_00220b56:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmake::SetDirectoriesFromFile(const std::string& arg)
{
  // Check if the argument refers to a CMakeCache.txt or
  // CMakeLists.txt file.
  std::string listPath;
  std::string cachePath;
  bool argIsFile = false;
  if (cmSystemTools::FileIsDirectory(arg)) {
    std::string path = cmSystemTools::CollapseFullPath(arg);
    cmSystemTools::ConvertToUnixSlashes(path);
    std::string cacheFile = path;
    cacheFile += "/CMakeCache.txt";
    std::string listFile = path;
    listFile += "/CMakeLists.txt";
    if (cmSystemTools::FileExists(cacheFile)) {
      cachePath = path;
    }
    if (cmSystemTools::FileExists(listFile)) {
      listPath = path;
    }
  } else if (cmSystemTools::FileExists(arg)) {
    argIsFile = true;
    std::string fullPath = cmSystemTools::CollapseFullPath(arg);
    std::string name = cmSystemTools::GetFilenameName(fullPath);
    name = cmSystemTools::LowerCase(name);
    if (name == "cmakecache.txt") {
      cachePath = cmSystemTools::GetFilenamePath(fullPath);
    } else if (name == "cmakelists.txt") {
      listPath = cmSystemTools::GetFilenamePath(fullPath);
    }
  } else {
    // Specified file or directory does not exist.  Try to set things
    // up to produce a meaningful error message.
    std::string fullPath = cmSystemTools::CollapseFullPath(arg);
    std::string name = cmSystemTools::GetFilenameName(fullPath);
    name = cmSystemTools::LowerCase(name);
    if (name == "cmakecache.txt" || name == "cmakelists.txt") {
      argIsFile = true;
      listPath = cmSystemTools::GetFilenamePath(fullPath);
    } else {
      listPath = fullPath;
    }
  }

  // If there is a CMakeCache.txt file, use its settings.
  if (!cachePath.empty()) {
    if (this->LoadCache(cachePath)) {
      const char* existingValue =
        this->State->GetCacheEntryValue("CMAKE_HOME_DIRECTORY");
      if (existingValue) {
        this->SetHomeOutputDirectory(cachePath);
        this->SetHomeDirectory(existingValue);
        return;
      }
    }
  }

  // If there is a CMakeLists.txt file, use it as the source tree.
  if (!listPath.empty()) {
    this->SetHomeDirectory(listPath);

    if (argIsFile) {
      // Source CMakeLists.txt file given.  It was probably dropped
      // onto the executable in a GUI.  Default to an in-source build.
      this->SetHomeOutputDirectory(listPath);
    } else {
      // Source directory given on command line.  Use current working
      // directory as build tree if -B hasn't been given already
      if (this->GetHomeOutputDirectory().empty()) {
        std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
        this->SetHomeOutputDirectory(cwd);
      }
    }
    return;
  }

  if (this->GetHomeDirectory().empty()) {
    // We didn't find a CMakeLists.txt and it wasn't specified
    // with -S. Assume it is the path to the source tree
    std::string full = cmSystemTools::CollapseFullPath(arg);
    this->SetHomeDirectory(full);
  }
  if (this->GetHomeOutputDirectory().empty()) {
    // We didn't find a CMakeCache.txt and it wasn't specified
    // with -B. Assume the current working directory as the build tree.
    std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
    this->SetHomeOutputDirectory(cwd);
  }
}